

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O2

int main(void)

{
  Am_Initialize();
  init_styles();
  init_wins();
  init_protos();
  install_ship_inters();
  install_phaser_inter();
  install_tractor_inter();
  install_long_range_feedback();
  install_stars();
  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}

Assistant:

int
main()
{
  Am_Initialize();

  init_styles();
  init_wins();   // defines SP_Outer_Win, SP_Clip_Win, SP_Short_Agg,
                 //    and SP_Long_Win
  init_protos(); // defines SP_Ship

  //  cout << "Turning on debugging\n";
  //  Am_Set_Inter_Trace(Am_INTER_TRACE_ALL);

  install_ship_inters();
  install_phaser_inter();
  install_tractor_inter();
  install_long_range_feedback();
  install_stars();

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}